

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdFlag.c
# Opt level: O1

void Cmd_FlagUpdateValue(Abc_Frame_t *pAbc,char *key,char *value)

{
  int iVar1;
  char *pcVar2;
  char *oldValue;
  char *local_28;
  char *local_20;
  
  if (key != (char *)0x0) {
    pcVar2 = "";
    if (value != (char *)0x0) {
      pcVar2 = value;
    }
    local_28 = key;
    pcVar2 = Extra_UtilStrsav(pcVar2);
    iVar1 = st__delete(pAbc->tFlags,&local_28,&local_20);
    if (local_20 != (char *)0x0 && iVar1 != 0) {
      free(local_20);
      local_20 = (char *)0x0;
    }
    st__insert(pAbc->tFlags,local_28,pcVar2);
  }
  return;
}

Assistant:

void Cmd_FlagUpdateValue( Abc_Frame_t * pAbc, const char * key, char * value )
{
    char * oldValue, * newValue;
    if ( !key )
        return;
    if ( value )
        newValue = Extra_UtilStrsav(value);
    else
        newValue = Extra_UtilStrsav("");
//        newValue = NULL;
    if ( st__delete(pAbc->tFlags, &key, &oldValue) )
        ABC_FREE(oldValue);
    st__insert( pAbc->tFlags, key, newValue );
}